

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O3

uint64_t duckdb_hll::MurmurHash64A(void *key,int len,uint seed)

{
  ulong uVar1;
  uint uVar2;
  byte *pbVar3;
  long lVar4;
  ulong uVar5;
  
  uVar1 = (long)len * -0x395b586ca42e166b ^ (ulong)seed;
  uVar2 = len & 0xfffffff8;
  pbVar3 = (byte *)key;
  if (uVar2 != 0) {
    pbVar3 = (byte *)((long)key + (long)(int)uVar2);
    lVar4 = 0;
    do {
      uVar5 = *(long *)((long)key + lVar4) * -0x395b586ca42e166b;
      uVar1 = (uVar1 ^ (uVar5 >> 0x2f ^ uVar5) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
      lVar4 = lVar4 + 8;
    } while ((int)uVar2 != lVar4);
  }
  switch(len & 7) {
  case 7:
    uVar1 = uVar1 ^ (ulong)pbVar3[6] << 0x30;
  case 6:
    uVar1 = uVar1 ^ (ulong)pbVar3[5] << 0x28;
  case 5:
    uVar1 = uVar1 ^ (ulong)pbVar3[4] << 0x20;
  case 4:
    uVar1 = uVar1 ^ (ulong)pbVar3[3] << 0x18;
  case 3:
    uVar1 = uVar1 ^ (ulong)pbVar3[2] << 0x10;
  case 2:
    uVar1 = uVar1 ^ (ulong)pbVar3[1] << 8;
  case 1:
    uVar1 = (*pbVar3 ^ uVar1) * -0x395b586ca42e166b;
  case 0:
    uVar1 = (uVar1 >> 0x2f ^ uVar1) * -0x395b586ca42e166b;
    return uVar1 >> 0x2f ^ uVar1;
  }
}

Assistant:

uint64_t MurmurHash64A (const void * key, int len, unsigned int seed) {
    const uint64_t m = 0xc6a4a7935bd1e995;
    const int r = 47;
    uint64_t h = seed ^ (len * m);
    const uint8_t *data = (const uint8_t *)key;
    const uint8_t *end = data + (len-(len&7));

    while(data != end) {
        uint64_t k;

#if (BYTE_ORDER == LITTLE_ENDIAN)
    #ifdef USE_ALIGNED_ACCESS
        memcpy(&k,data,sizeof(uint64_t));
    #else
        k = *((uint64_t*)data);
    #endif
#else
        k = (uint64_t) data[0];
        k |= (uint64_t) data[1] << 8;
        k |= (uint64_t) data[2] << 16;
        k |= (uint64_t) data[3] << 24;
        k |= (uint64_t) data[4] << 32;
        k |= (uint64_t) data[5] << 40;
        k |= (uint64_t) data[6] << 48;
        k |= (uint64_t) data[7] << 56;
#endif

        k *= m;
        k ^= k >> r;
        k *= m;
        h ^= k;
        h *= m;
        data += 8;
    }

    switch(len & 7) {
    case 7: h ^= (uint64_t)data[6] << 48; /* fall-thru */
    case 6: h ^= (uint64_t)data[5] << 40; /* fall-thru */
    case 5: h ^= (uint64_t)data[4] << 32; /* fall-thru */
    case 4: h ^= (uint64_t)data[3] << 24; /* fall-thru */
    case 3: h ^= (uint64_t)data[2] << 16; /* fall-thru */
    case 2: h ^= (uint64_t)data[1] << 8; /* fall-thru */
    case 1: h ^= (uint64_t)data[0];
            h *= m; /* fall-thru */
    };

    h ^= h >> r;
    h *= m;
    h ^= h >> r;
    return h;
}